

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O0

void __thiscall
soul::ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL>::erase
          (ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this,
          Section *startElement,Section *endElement)

{
  Section *pSVar1;
  size_t sVar2;
  bool local_51;
  bool local_31;
  Section *local_30;
  Section *src;
  Section *dest;
  Section *endElement_local;
  Section *startElement_local;
  ArrayWithPreallocation<soul::TokenisedPathString::Section,_8UL> *this_local;
  
  local_31 = false;
  if (startElement != (Section *)0x0) {
    pSVar1 = begin(this);
    local_31 = false;
    if (pSVar1 <= startElement) {
      pSVar1 = end(this);
      local_31 = startElement <= pSVar1;
    }
  }
  checkAssertion(local_31,
                 "startElement != nullptr && startElement >= begin() && startElement <= end()",
                 "erase",0x124);
  local_51 = false;
  if (endElement != (Section *)0x0) {
    pSVar1 = begin(this);
    local_51 = false;
    if (pSVar1 <= endElement) {
      pSVar1 = end(this);
      local_51 = endElement <= pSVar1;
    }
  }
  checkAssertion(local_51,"endElement != nullptr && endElement >= begin() && endElement <= end()",
                 "erase",0x125);
  if (startElement != endElement) {
    checkAssertion(startElement < endElement,"startElement < endElement","erase",0x12a);
    pSVar1 = end(this);
    local_30 = endElement;
    src = startElement;
    if (endElement == pSVar1) {
      pSVar1 = begin(this);
      shrink(this,(long)startElement - (long)pSVar1 >> 4);
    }
    else {
      for (; pSVar1 = end(this), local_30 < pSVar1; local_30 = local_30 + 1) {
        src->start = local_30->start;
        src->end = local_30->end;
        src = src + 1;
      }
      sVar2 = size(this);
      shrink(this,sVar2 - ((long)endElement - (long)startElement >> 4));
    }
  }
  return;
}

Assistant:

void erase (Item* startElement, Item* endElement)
    {
        SOUL_ASSERT (startElement != nullptr && startElement >= begin() && startElement <= end());
        SOUL_ASSERT (endElement != nullptr && endElement >= begin() && endElement <= end());

        if (startElement == endElement)
            return;

        SOUL_ASSERT (startElement < endElement);

        if (endElement == end())
            return shrink ((size_t) (startElement - begin()));

        auto dest = startElement;

        for (auto src = endElement; src < end(); ++dest, ++src)
            *dest = std::move (*src);

        shrink (size() - (size_t) (endElement - startElement));
    }